

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O2

int flvtag_updatesize(flvtag_t *tag,uint32_t size)

{
  uint uVar1;
  
  tag->data[1] = (uint8_t)(size >> 0x10);
  tag->data[2] = (uint8_t)(size >> 8);
  tag->data[3] = (uint8_t)size;
  uVar1 = size + 0xb;
  tag->data[uVar1] = (uint8_t)(uVar1 >> 0x18);
  tag->data[size + 0xc] = (uint8_t)(uVar1 >> 0x10);
  tag->data[size + 0xd] = (uint8_t)(uVar1 >> 8);
  tag->data[size + 0xe] = (uint8_t)uVar1;
  return 1;
}

Assistant:

int flvtag_updatesize(flvtag_t* tag, uint32_t size)
{
    tag->data[1] = size >> 16; // DataSize
    tag->data[2] = size >> 8; // DataSize
    tag->data[3] = size >> 0; // DataSize
    size += 11;
    tag->data[size + 0] = size >> 24; // PrevTagSize
    tag->data[size + 1] = size >> 16; // PrevTagSize
    tag->data[size + 2] = size >> 8; // PrevTagSize
    tag->data[size + 3] = size >> 0; // PrevTagSize
    return 1;
}